

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_getstr(Table *t,TString *key)

{
  TString *x_;
  TValue *io;
  TValue ko;
  TString *key_local;
  Table *t_local;
  
  ko._8_8_ = key;
  if (key->tt == '\x04') {
    t_local = (Table *)luaH_getshortstr(t,key);
  }
  else {
    ko.value_.b = key->tt | 0x40;
    io = (TValue *)key;
    t_local = (Table *)getgeneric(t,(TValue *)&io);
  }
  return (TValue *)t_local;
}

Assistant:

const TValue *luaH_getstr (Table *t, TString *key) {
  if (key->tt == LUA_TSHRSTR)
    return luaH_getshortstr(t, key);
  else {  /* for long strings, use generic case */
    TValue ko;
    setsvalue(cast(lua_State *, NULL), &ko, key);
    return getgeneric(t, &ko);
  }
}